

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O2

int stbir_resize_subpixel
              (void *input_pixels,int input_w,int input_h,int input_stride_in_bytes,
              void *output_pixels,int output_w,int output_h,int output_stride_in_bytes,
              stbir_datatype datatype,int num_channels,int alpha_channel,int flags,
              stbir_edge edge_mode_horizontal,stbir_edge edge_mode_vertical,
              stbir_filter filter_horizontal,stbir_filter filter_vertical,stbir_colorspace space,
              void *alloc_context,float x_scale,float y_scale,float x_offset,float y_offset)

{
  int iVar1;
  undefined4 in_register_00000034;
  undefined4 in_register_0000008c;
  float transform [4];
  
  transform[0] = x_scale;
  transform[1] = y_scale;
  transform[2] = x_offset;
  transform[3] = y_offset;
  iVar1 = stbir__resize_arbitrary
                    (input_pixels,(void *)CONCAT44(in_register_00000034,input_w),input_h,
                     input_stride_in_bytes,(int)output_pixels,
                     (void *)CONCAT44(in_register_0000008c,output_w),output_h,output_stride_in_bytes
                     ,(int)transform,0.0,0.0,1.0,1.0,(float *)(ulong)(uint)num_channels,
                     alpha_channel,flags,datatype,filter_horizontal,filter_vertical,
                     edge_mode_horizontal,edge_mode_vertical,space,(stbir_colorspace)x_scale);
  return iVar1;
}

Assistant:

STBIRDEF int stbir_resize_subpixel(const void *input_pixels , int input_w , int input_h , int input_stride_in_bytes,
                                         void *output_pixels, int output_w, int output_h, int output_stride_in_bytes,
                                   stbir_datatype datatype,
                                   int num_channels, int alpha_channel, int flags,
                                   stbir_edge edge_mode_horizontal, stbir_edge edge_mode_vertical,
                                   stbir_filter filter_horizontal,  stbir_filter filter_vertical,
                                   stbir_colorspace space, void *alloc_context,
                                   float x_scale, float y_scale,
                                   float x_offset, float y_offset)
{
    float transform[4];
    transform[0] = x_scale;
    transform[1] = y_scale;
    transform[2] = x_offset;
    transform[3] = y_offset;
    return stbir__resize_arbitrary(alloc_context, input_pixels, input_w, input_h, input_stride_in_bytes,
        output_pixels, output_w, output_h, output_stride_in_bytes,
        0,0,1,1,transform,num_channels,alpha_channel,flags, datatype, filter_horizontal, filter_vertical,
        edge_mode_horizontal, edge_mode_vertical, space);
}